

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSAXMLScanner.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XSAXMLScanner::switchGrammar(XSAXMLScanner *this,XMLCh *uriStr,bool laxValidate)

{
  XMLValidator *pXVar1;
  bool bVar2;
  int iVar3;
  SchemaGrammar *local_28;
  Grammar *tempGrammar;
  bool laxValidate_local;
  XMLCh *uriStr_local;
  XSAXMLScanner *this_local;
  
  bVar2 = XMLString::equals(uriStr,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  if (bVar2) {
    local_28 = (this->super_SGXMLScanner).fSchemaGrammar;
  }
  else {
    local_28 = (SchemaGrammar *)
               GrammarResolver::getGrammar
                         ((this->super_SGXMLScanner).super_XMLScanner.fGrammarResolver,uriStr);
  }
  if ((local_28 == (SchemaGrammar *)0x0) ||
     (iVar3 = (*(local_28->super_Grammar).super_XSerializable._vptr_XSerializable[5])(), iVar3 != 1)
     ) {
    if (!laxValidate) {
      XMLValidator::emitError
                ((this->super_SGXMLScanner).super_XMLScanner.fValidator,GrammarNotFound,uriStr,
                 (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
  }
  else {
    (this->super_SGXMLScanner).super_XMLScanner.fGrammar = &local_28->super_Grammar;
    (this->super_SGXMLScanner).fGrammarType = SchemaGrammarType;
    pXVar1 = (this->super_SGXMLScanner).super_XMLScanner.fValidator;
    (*pXVar1->_vptr_XMLValidator[0xb])(pXVar1,(this->super_SGXMLScanner).super_XMLScanner.fGrammar);
  }
  return;
}

Assistant:

void XSAXMLScanner::switchGrammar( const XMLCh* const uriStr
                                 , bool laxValidate)
{
    Grammar* tempGrammar = 0;

    if (XMLString::equals(uriStr, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)) {
        tempGrammar = fSchemaGrammar;
    }
    else {
        tempGrammar = fGrammarResolver->getGrammar(uriStr);
    }

    if (tempGrammar && tempGrammar->getGrammarType() == Grammar::SchemaGrammarType)
    {
        fGrammar = tempGrammar;
        fGrammarType = Grammar::SchemaGrammarType;
        fValidator->setGrammar(fGrammar);
    }
    else if(!laxValidate) {
        fValidator->emitError(XMLValid::GrammarNotFound, uriStr);
    }
}